

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float * __thiscall ImGuiStorage::GetFloatRef(ImGuiStorage *this,ImGuiID key,float default_val)

{
  Pair *it_00;
  Pair *pPVar1;
  Pair *pPVar2;
  Pair local_30;
  Pair *local_20;
  Pair *it;
  float default_val_local;
  ImGuiID key_local;
  ImGuiStorage *this_local;
  
  it._0_4_ = default_val;
  it._4_4_ = key;
  _default_val_local = this;
  pPVar1 = LowerBound(&this->Data,key);
  local_20 = pPVar1;
  pPVar2 = ImVector<ImGuiStorage::Pair>::end(&this->Data);
  it_00 = local_20;
  if ((pPVar1 == pPVar2) || (local_20->key != it._4_4_)) {
    Pair::Pair(&local_30,it._4_4_,it._0_4_);
    local_20 = ImVector<ImGuiStorage::Pair>::insert(&this->Data,it_00,&local_30);
  }
  return (float *)&local_20->field_1;
}

Assistant:

float* ImGuiStorage::GetFloatRef(ImGuiID key, float default_val)
{
    ImGuiStorage::Pair* it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
        it = Data.insert(it, Pair(key, default_val));
    return &it->val_f;
}